

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

void __thiscall imrt::Collimator::generateReference(Collimator *this)

{
  map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
  *this_00;
  uint in_EAX;
  mapped_type *pmVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 local_38;
  
  this_00 = &this->reference;
  local_38 = (ulong)in_EAX;
  pmVar1 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,(key_type_conflict *)((long)&local_38 + 4));
  pmVar1->first = -1;
  pmVar1->second = -1;
  local_38._0_4_ = 1;
  iVar2 = this->ydim;
  for (iVar3 = 1; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    for (iVar4 = 0; iVar3 + iVar4 < iVar2; iVar4 = iVar4 + 1) {
      pmVar1 = std::
               map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
               ::operator[](this_00,(key_type_conflict *)&local_38);
      pmVar1->first = iVar4;
      pmVar1->second = iVar3 + iVar4;
      local_38._0_4_ = (int)local_38 + 1;
      iVar2 = this->ydim;
    }
  }
  pmVar1 = std::
           map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
           ::operator[](this_00,(key_type_conflict *)&local_38);
  pmVar1->first = 0;
  pmVar1->second = iVar2 + -1;
  this->ref_size = (int)local_38;
  return;
}

Assistant:

void Collimator::generateReference () {
    int i = 0;
    reference[0] = make_pair(-1,-1);
    i = 1;
    for (int s = 1; s < getYdim(); s++) {
      for (int j = 0; (j+s) < getYdim(); j++) {
        reference[i] = make_pair(j,j+s);
        i++;
      }
    }
    reference[i] = make_pair(0, getYdim()-1);
    ref_size = i;
  }